

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  uint uVar1;
  char *ptr;
  long lVar2;
  ulong uVar3;
  
  uVar1 = (ctx->Tables).Buf.Size;
  if ((ulong)uVar1 != 0) {
    lVar2 = 0;
    uVar3 = 0;
    if (0 < (int)uVar1) {
      uVar3 = (ulong)uVar1;
    }
    do {
      if (uVar3 * 0x250 - lVar2 == 0) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.h"
                      ,0x658,"T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]");
      }
      *(undefined4 *)((long)((ctx->Tables).Buf.Data)->RowBgColor + lVar2 + -0x34) = 0xffffffff;
      lVar2 = lVar2 + 0x250;
    } while ((ulong)uVar1 * 0x250 - lVar2 != 0);
  }
  ptr = (ctx->SettingsTables).Buf.Data;
  if (ptr != (char *)0x0) {
    (ctx->SettingsTables).Buf.Size = 0;
    (ctx->SettingsTables).Buf.Capacity = 0;
    ImGui::MemFree(ptr);
    (ctx->SettingsTables).Buf.Data = (char *)0x0;
  }
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetSize(); i++)
        g.Tables.GetByIndex(i)->SettingsOffset = -1;
    g.SettingsTables.clear();
}